

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* CLI::detail::get_names
            (tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *input,bool allow_non_standard)

{
  bool bVar1;
  reference pbVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  BadNameString *pBVar6;
  bool local_2a9;
  string local_238;
  undefined1 local_211;
  string local_210;
  undefined1 local_1e9;
  string local_1e8;
  undefined1 local_1c1;
  string local_1c0;
  string local_1a0 [39];
  byte local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  undefined1 local_151;
  string local_150;
  undefined1 local_129;
  string local_128;
  undefined1 local_101;
  string local_100;
  string local_e0 [36];
  int local_bc [5];
  undefined1 local_a8 [8];
  string name;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string pos_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  long_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  short_names;
  bool allow_non_standard_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *input_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&long_names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&pos_name.field_2 + 8));
  ::std::__cxx11::string::string((string *)&__range2);
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(input);
  name.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(input);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&name.field_2 + 8));
    if (!bVar1) {
      ::std::
      make_tuple<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&>
                (__return_storage_ptr__,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&long_names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&pos_name.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2);
      local_bc[1] = 1;
      ::std::__cxx11::string::~string((string *)&__range2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&pos_name.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&long_names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      return __return_storage_ptr__;
    }
    pbVar2 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2);
    ::std::__cxx11::string::string((string *)local_a8,(string *)pbVar2);
    lVar3 = ::std::__cxx11::string::length();
    if (lVar3 == 0) {
      local_bc[1] = 3;
    }
    else {
      uVar4 = ::std::__cxx11::string::length();
      if (((uVar4 < 2) ||
          (pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)local_a8), *pcVar5 != '-')) ||
         (pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)local_a8), *pcVar5 == '-')) {
        uVar4 = ::std::__cxx11::string::length();
        local_179 = 0;
        local_2a9 = false;
        if (2 < uVar4) {
          ::std::__cxx11::string::substr((ulong)&local_178,(ulong)local_a8);
          local_179 = 1;
          local_2a9 = ::std::operator==(&local_178,"--");
        }
        if ((local_179 & 1) != 0) {
          ::std::__cxx11::string::~string((string *)&local_178);
        }
        if (local_2a9 == false) {
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_a8,"-");
          if (((bVar1) ||
              (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_a8,"--"), bVar1)) ||
             (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_a8,"++"), bVar1)) {
            local_1e9 = 1;
            pBVar6 = (BadNameString *)__cxa_allocate_exception(0x38);
            ::std::__cxx11::string::string((string *)&local_1e8,(string *)local_a8);
            BadNameString::ReservedName(pBVar6,&local_1e8);
            local_1e9 = 0;
            __cxa_throw(pBVar6,&BadNameString::typeinfo,BadNameString::~BadNameString);
          }
          uVar4 = ::std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            local_211 = 1;
            pBVar6 = (BadNameString *)__cxa_allocate_exception(0x38);
            ::std::__cxx11::string::string((string *)&local_210,(string *)local_a8);
            BadNameString::MultiPositionalNames(pBVar6,&local_210);
            local_211 = 0;
            __cxa_throw(pBVar6,&BadNameString::typeinfo,BadNameString::~BadNameString);
          }
          bVar1 = valid_name_string((string *)local_a8);
          if (!bVar1) {
            pBVar6 = (BadNameString *)__cxa_allocate_exception(0x38);
            ::std::__cxx11::string::string((string *)&local_238,(string *)local_a8);
            BadNameString::BadPositionalName(pBVar6,&local_238);
            __cxa_throw(pBVar6,&BadNameString::typeinfo,BadNameString::~BadNameString);
          }
          ::std::__cxx11::string::operator=((string *)&__range2,(string *)local_a8);
        }
        else {
          ::std::__cxx11::string::substr((ulong)local_1a0,(ulong)local_a8);
          ::std::__cxx11::string::operator=((string *)local_a8,local_1a0);
          ::std::__cxx11::string::~string(local_1a0);
          bVar1 = valid_name_string((string *)local_a8);
          if (!bVar1) {
            local_1c1 = 1;
            pBVar6 = (BadNameString *)__cxa_allocate_exception(0x38);
            ::std::__cxx11::string::string((string *)&local_1c0,(string *)local_a8);
            BadNameString::BadLongName(pBVar6,&local_1c0);
            local_1c1 = 0;
            __cxa_throw(pBVar6,&BadNameString::typeinfo,BadNameString::~BadNameString);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&pos_name.field_2 + 8),(value_type *)local_a8);
        }
      }
      else {
        lVar3 = ::std::__cxx11::string::length();
        if (lVar3 == 2) {
          pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)local_a8);
          bVar1 = valid_first_char<char>(*pcVar5);
          if (bVar1) {
            local_bc[0] = 1;
            pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)local_a8);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<int,char&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &long_names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,local_bc,pcVar5);
            goto LAB_0015510a;
          }
        }
        uVar4 = ::std::__cxx11::string::length();
        if (uVar4 < 3) {
          local_151 = 1;
          pBVar6 = (BadNameString *)__cxa_allocate_exception(0x38);
          ::std::__cxx11::string::string((string *)&local_150,(string *)local_a8);
          BadNameString::OneCharName(pBVar6,&local_150);
          local_151 = 0;
          __cxa_throw(pBVar6,&BadNameString::typeinfo,BadNameString::~BadNameString);
        }
        if (!allow_non_standard) {
          local_129 = 1;
          pBVar6 = (BadNameString *)__cxa_allocate_exception(0x38);
          ::std::__cxx11::string::string((string *)&local_128,(string *)local_a8);
          BadNameString::MissingDash(pBVar6,&local_128);
          local_129 = 0;
          __cxa_throw(pBVar6,&BadNameString::typeinfo,BadNameString::~BadNameString);
        }
        ::std::__cxx11::string::substr((ulong)local_e0,(ulong)local_a8);
        ::std::__cxx11::string::operator=((string *)local_a8,local_e0);
        ::std::__cxx11::string::~string(local_e0);
        bVar1 = valid_name_string((string *)local_a8);
        if (!bVar1) {
          local_101 = 1;
          pBVar6 = (BadNameString *)__cxa_allocate_exception(0x38);
          ::std::__cxx11::string::string((string *)&local_100,(string *)local_a8);
          BadNameString::BadLongName(pBVar6,&local_100);
          local_101 = 0;
          __cxa_throw(pBVar6,&BadNameString::typeinfo,BadNameString::~BadNameString);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&long_names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_a8);
      }
LAB_0015510a:
      local_bc[1] = 0;
    }
    ::std::__cxx11::string::~string((string *)local_a8);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

CLI11_INLINE std::tuple<std::vector<std::string>, std::vector<std::string>, std::string>
get_names(const std::vector<std::string> &input, bool allow_non_standard) {

    std::vector<std::string> short_names;
    std::vector<std::string> long_names;
    std::string pos_name;
    for(std::string name : input) {
        if(name.length() == 0) {
            continue;
        }
        if(name.length() > 1 && name[0] == '-' && name[1] != '-') {
            if(name.length() == 2 && valid_first_char(name[1])) {
                short_names.emplace_back(1, name[1]);
            } else if(name.length() > 2) {
                if(allow_non_standard) {
                    name = name.substr(1);
                    if(valid_name_string(name)) {
                        short_names.push_back(name);
                    } else {
                        throw BadNameString::BadLongName(name);
                    }
                } else {
                    throw BadNameString::MissingDash(name);
                }
            } else {
                throw BadNameString::OneCharName(name);
            }
        } else if(name.length() > 2 && name.substr(0, 2) == "--") {
            name = name.substr(2);
            if(valid_name_string(name)) {
                long_names.push_back(name);
            } else {
                throw BadNameString::BadLongName(name);
            }
        } else if(name == "-" || name == "--" || name == "++") {
            throw BadNameString::ReservedName(name);
        } else {
            if(!pos_name.empty()) {
                throw BadNameString::MultiPositionalNames(name);
            }
            if(valid_name_string(name)) {
                pos_name = name;
            } else {
                throw BadNameString::BadPositionalName(name);
            }
        }
    }
    return std::make_tuple(short_names, long_names, pos_name);
}